

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

QString * __thiscall QTextEdit::anchorAt(QTextEdit *this,QPoint *pos)

{
  QWidgetTextControl *pQVar1;
  QTextEditPrivate *this_00;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QTextEditPrivate *d;
  QPoint *in_stack_ffffffffffffff98;
  QPointF *this_01;
  QPoint *in_stack_ffffffffffffffb8;
  undefined1 *puVar2;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QTextEdit *)0x6d55cc);
  pQVar1 = this_00->control;
  QTextEditPrivate::mapToContents(this_00,in_stack_ffffffffffffffb8);
  puVar2 = local_18;
  QPointF::QPointF(this_01,in_stack_ffffffffffffff98);
  (**(code **)(*(long *)pQVar1 + 0x70))(in_RDI,pQVar1,puVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextEdit::anchorAt(const QPoint& pos) const
{
    Q_D(const QTextEdit);
    return d->control->anchorAt(d->mapToContents(pos));
}